

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::IAsyncTask> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IAsyncTask>::operator=
          (RefCntAutoPtr<Diligent::IAsyncTask> *this,RefCntAutoPtr<Diligent::IAsyncTask> *AutoPtr)

{
  IAsyncTask *pIVar1;
  IAsyncTask *pObj;
  
  pIVar1 = AutoPtr->m_pObject;
  if (this->m_pObject != pIVar1) {
    AutoPtr->m_pObject = (IAsyncTask *)0x0;
    Release(this);
    this->m_pObject = pIVar1;
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }